

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::BlendTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BlendTestInstance *this)

{
  _func_int **pp_Var1;
  pointer pVVar2;
  TestLog *log;
  bool bVar3;
  VkResult VVar4;
  deUint32 queueFamilyIndex;
  TextureChannelClass TVar5;
  TextureChannelClass TVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  VkQueue pVVar9;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  TextureFormat tcuColorFormat;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  TextureFormat tcuDepthFormat;
  Vec4 threshold;
  SimpleAllocator allocator;
  ColorVertexShader vertexShader;
  Program program;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  size_type __dnew;
  VkSubmitInfo submitInfo;
  TextureFormat local_660;
  undefined1 local_658 [16];
  TestStatus *local_648;
  UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_640;
  TextureFormat local_630;
  Vec4 local_628;
  ConstPixelBufferAccess local_610;
  undefined1 local_5e8 [24];
  undefined1 local_5d0 [196];
  VkMemoryType local_50c;
  VertexShader local_3c8;
  Program local_390;
  ColorFragmentShader local_378;
  ReferenceRenderer local_330;
  VkPhysicalDeviceMemoryProperties local_280;
  undefined4 local_78;
  undefined1 auStack_74 [12];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  local_658._8_8_ = local_658._0_8_;
  local_648 = __return_storage_ptr__;
  pDVar7 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_38 = 0;
  local_68 = (undefined1  [16])0x0;
  auStack_74 = SUB1612((undefined1  [16])0x0,4);
  local_78 = 4;
  local_58._0_12_ = ZEXT412(1) << 0x40;
  local_58._12_4_ = 0;
  local_48._8_8_ = 0;
  local_48._0_8_ = &this->m_cmdBuffer;
  VVar4 = (*pDVar7->_vptr_DeviceInterface[0x14])(pDVar7,pVVar8,1,&this->m_fence);
  ::vk::checkResult(VVar4,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x310);
  VVar4 = (*pDVar7->_vptr_DeviceInterface[2])
                    (pDVar7,pVVar9,1,&local_78,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x311);
  VVar4 = (*pDVar7->_vptr_DeviceInterface[0x16])
                    (pDVar7,pVVar8,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x312);
  local_660 = ::vk::mapVkFormat(this->m_colorFormat);
  local_630.order = CHANNELORDER_LAST;
  local_630.type = CHANNELTYPE_LAST;
  rr::VertexShader::VertexShader(&local_3c8,2,2);
  local_3c8._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d27600;
  *(undefined8 *)
   local_3c8.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_3c8.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_3c8.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
  ColorFragmentShader::ColorFragmentShader(&local_378,&local_660,&local_630);
  local_390.geometryShader = (GeometryShader *)0x0;
  local_390.vertexShader = &local_3c8;
  local_390.fragmentShader = &local_378.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&local_330,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,&local_660,
             &local_630,&local_390);
  local_658._0_8_ = &this->m_renderSize;
  lVar11 = 0;
  lVar12 = 0;
  do {
    ReferenceRenderer::getViewportState(&local_330);
    local_5e8._0_8_ = (_func_int **)0x100000000;
    local_5e8._8_8_ = (DeviceInterface *)0x0;
    local_5e8._16_4_ = FILL_BOTTOM;
    local_5e8._20_2_ = VIEWPORTORIENTATION_LAST;
    local_5e8._22_2_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x10;
    rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_5d0);
    local_5d0._160_4_ = 1.0;
    local_5d0._180_4_ = local_280.memoryTypes[1].heapIndex;
    local_5d0._184_4_ = local_280.memoryTypes[2].propertyFlags;
    local_5d0._164_4_ = local_280.memoryTypeCount;
    local_5d0._168_4_ = local_280.memoryTypes[0].propertyFlags;
    local_5d0._172_4_ = local_280.memoryTypes[0].heapIndex;
    local_5d0._176_4_ = local_280.memoryTypes[1].propertyFlags;
    local_5d0._188_4_ = 1.0;
    local_5d0[0xc0] = false;
    local_50c.propertyFlags = 0xffffffff;
    local_50c.heapIndex = 0;
    local_5e8._20_2_ = VIEWPORTORIENTATION_LOWER_LEFT;
    local_5e8._22_2_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x10;
    local_5d0._92_4_ = BLENDMODE_STANDARD;
    local_5d0._100_4_ = mapVkBlendFactor((&this->m_blendStates[0].srcColorBlendFactor)[lVar12 * 2]);
    local_5d0._104_4_ = mapVkBlendFactor((&this->m_blendStates[0].dstColorBlendFactor)[lVar12 * 2]);
    local_5d0._96_4_ = mapVkBlendOp((&this->m_blendStates[0].colorBlendOp)[lVar12 * 2]);
    local_5d0._112_4_ = mapVkBlendFactor((&this->m_blendStates[0].srcAlphaBlendFactor)[lVar12 * 2]);
    local_5d0._116_4_ = mapVkBlendFactor((&this->m_blendStates[0].dstAlphaBlendFactor)[lVar12 * 2]);
    local_5d0._108_4_ = mapVkBlendOp((&this->m_blendStates[0].alphaBlendOp)[lVar12 * 2]);
    local_5d0._120_8_ = 0x3e4ccccd3dcccccd;
    local_5d0._128_8_ = 0x3ecccccd3e99999a;
    mapVkColorComponentFlags
              ((pipeline *)&local_280,
               *(VkColorComponentFlags *)
                ((long)&pipeline::(anonymous_namespace)::BlendTest::s_colorWriteMasks + lVar12));
    local_5d0._152_4_ = local_280.memoryTypeCount;
    pVVar2 = (this->m_vertices).
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_280,(Vertex4RGBA *)((long)(pVVar2->position).m_data + lVar11),
               (Vertex4RGBA *)((long)pVVar2[6].position.m_data + lVar11),
               (allocator_type *)&local_610);
    ReferenceRenderer::draw
              (&local_330,(RenderState *)local_5e8,PRIMITIVETYPE_TRIANGLES,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &local_280);
    if ((TextureFormat)local_280._0_8_ != (TextureFormat)0x0) {
      operator_delete((void *)local_280._0_8_,local_280.memoryTypes._12_8_ - local_280._0_8_);
    }
    lVar12 = lVar12 + 4;
    lVar11 = lVar11 + 0xc0;
  } while (lVar12 != 0x10);
  pDVar7 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&local_280,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator((SimpleAllocator *)local_5e8,pDVar7,pVVar8,&local_280);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &local_280,pDVar7,pVVar8,pVVar9,queueFamilyIndex,(Allocator *)local_5e8,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,(UVec2 *)local_658._0_8_
                     );
  local_640.m_data.ptr = (TextureLevel *)local_280._0_8_;
  local_280.memoryTypeCount = R;
  local_280.memoryTypes[0].propertyFlags = SNORM_INT8;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_280);
  fVar15 = 0.01;
  local_628.m_data[1] = 0.01;
  local_628.m_data[2] = 0.01;
  local_628.m_data[3] = 0.01;
  switch(local_660.type) {
  case SNORM_INT8:
  case UNORM_INT8:
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      fVar15 = 0.031496063;
    }
    else {
      fVar15 = 0.0;
    }
    local_628.m_data[1] = fVar15;
    local_628.m_data[2] = fVar15;
    local_628.m_data[3] = fVar15;
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar15 = 0.015686275;
      local_628.m_data[1] = fVar15;
      local_628.m_data[2] = fVar15;
      local_628.m_data[3] = fVar15;
    }
    break;
  case SNORM_INT16:
  case UNORM_INT16:
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      fVar15 = 0.00012207404;
    }
    else {
      fVar15 = 0.0;
    }
    local_628.m_data[1] = fVar15;
    local_628.m_data[2] = fVar15;
    local_628.m_data[3] = fVar15;
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar15 = 6.103609e-05;
      local_628.m_data[1] = fVar15;
      local_628.m_data[2] = fVar15;
      local_628.m_data[3] = fVar15;
    }
    break;
  case SNORM_INT32:
  case UNORM_INT32:
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      fVar15 = 1.8626451e-09;
      local_628.m_data[1] = fVar15;
      local_628.m_data[2] = fVar15;
      local_628.m_data[3] = fVar15;
    }
    else {
      fVar15 = 0.0;
      local_628.m_data[1] = fVar15;
      local_628.m_data[2] = fVar15;
      local_628.m_data[3] = fVar15;
    }
    break;
  case UNORM_BYTE_44:
    TVar5 = tcu::getTextureChannelClass(UNORM_BYTE_44);
    TVar6 = tcu::getTextureChannelClass(local_660.type);
    fVar15 = (float)(-(uint)(TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) & 0x3e888889 |
                    ~-(uint)(TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) &
                    -(uint)(TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) & 0x3f124925);
    local_628.m_data[1] =
         (float)(-(uint)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) & 0x3e888889 |
                ~-(uint)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) &
                -(uint)(TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) & 0x3f124925);
    local_628.m_data[2] = 1.0;
    local_628.m_data[3] = 1.0;
    break;
  case UNORM_SHORT_565:
    TVar5 = tcu::getTextureChannelClass(UNORM_SHORT_565);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3e888889);
    }
    else {
      local_658 = (undefined1  [16])0x0;
    }
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3e042108);
    }
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    TVar6 = tcu::getTextureChannelClass(local_660.type);
    uVar13 = CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT),
                      -(uint)(TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT));
    uVar14 = ~uVar13 & CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT),
                                -(uint)(TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) &
                       (ulong)DAT_00adf5f0;
    uVar13 = uVar13 & (ulong)DAT_00adf600;
    goto LAB_004a3efb;
  case UNORM_SHORT_555:
    TVar5 = tcu::getTextureChannelClass(UNORM_SHORT_555);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3e888889);
    }
    else {
      local_658 = (undefined1  [16])0x0;
    }
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3e042108);
    }
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    TVar6 = tcu::getTextureChannelClass(local_660.type);
    uVar13 = CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT),
                      -(uint)(TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT));
    uVar14 = ~uVar13 & CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT),
                                -(uint)(TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) &
                       (ulong)DAT_00adf5d0;
    uVar13 = uVar13 & (ulong)DAT_00adf5e0;
LAB_004a3efb:
    uVar13 = uVar13 | uVar14;
    local_628.m_data[3] = 1.0;
    goto LAB_004a3f07;
  case UNORM_SHORT_4444:
    TVar5 = tcu::getTextureChannelClass(UNORM_SHORT_4444);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      fVar15 = 0.5714286;
    }
    else {
      fVar15 = 0.0;
    }
    local_628.m_data[1] = fVar15;
    local_628.m_data[2] = fVar15;
    local_628.m_data[3] = fVar15;
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar15 = 0.26666668;
      local_628.m_data[1] = fVar15;
      local_628.m_data[2] = fVar15;
      local_628.m_data[3] = fVar15;
    }
    break;
  case UNORM_SHORT_5551:
    TVar5 = tcu::getTextureChannelClass(UNORM_SHORT_5551);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3e888889);
    }
    else {
      local_658 = (undefined1  [16])0x0;
    }
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3e042108);
    }
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    TVar6 = tcu::getTextureChannelClass(local_660.type);
    uVar13 = CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT),
                      -(uint)(TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT));
    uVar13 = uVar13 & (ulong)DAT_00adf5e0 |
             ~uVar13 & CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT),
                                -(uint)(TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) &
                       (ulong)DAT_00adf5d0;
    local_628.m_data[3] = 0.1;
    goto LAB_004a3f07;
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    if (TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3c004020);
    }
    else {
      local_658 = (undefined1  [16])0x0;
    }
    if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_658 = ZEXT416(0x3b802008);
    }
    TVar5 = tcu::getTextureChannelClass(local_660.type);
    TVar6 = tcu::getTextureChannelClass(local_660.type);
    uVar13 = CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT),
                      -(uint)(TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT));
    uVar13 = uVar13 & (ulong)DAT_00adf5c0 |
             ~uVar13 & CONCAT44(-(uint)(TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT),
                                -(uint)(TVar5 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) &
                       (ulong)DAT_00adf5b0;
    local_628.m_data[3] = 0.34;
LAB_004a3f07:
    fVar15 = (float)local_658._0_4_;
    local_628.m_data[1] = (float)uVar13;
    local_628.m_data[2] = (float)(uVar13 >> 0x20);
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    fVar15 = 0.02;
    local_628.m_data[1] = 0.02;
    local_628.m_data[2] = 0.0625;
    local_628.m_data[3] = 1.0;
    break;
  case UNSIGNED_INT_999_E5_REV:
    fVar15 = 0.05;
    local_628.m_data[1] = 0.05;
    local_628.m_data[2] = 0.05;
    local_628.m_data[3] = 1.0;
    break;
  case HALF_FLOAT:
    fVar15 = 0.005;
    local_628.m_data[1] = 0.005;
    local_628.m_data[2] = 0.005;
    local_628.m_data[3] = 0.005;
    break;
  case FLOAT:
    fVar15 = 1e-05;
    local_628.m_data[1] = 1e-05;
    local_628.m_data[2] = 1e-05;
    local_628.m_data[3] = 1e-05;
  }
  local_628.m_data[0] = fVar15;
  if ((local_660.order & ~A) == BGR) {
    local_628.m_data[0] = local_628.m_data[2];
    local_628.m_data[2] = fVar15;
  }
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&local_280,&local_330);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_610,local_640.m_data.ptr);
  bVar3 = tcu::floatThresholdCompare
                    (log,"FloatImageCompare","Image comparison",(ConstPixelBufferAccess *)&local_280
                     ,&local_610,&local_628,COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&local_640);
  pTVar10 = local_648;
  pp_Var1 = (_func_int **)(local_5e8 + 0x10);
  local_5e8._0_8_ = pp_Var1;
  if (bVar3) {
    local_280.memoryTypeCount = sBGR|sRGB;
    local_280.memoryTypes[0].propertyFlags = SNORM_INT8;
    local_5e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_5e8,(ulong)&local_280);
    pTVar10 = local_648;
    local_5e8._16_4_ = local_280.memoryTypeCount;
    local_5e8._20_2_ = (undefined2)local_280.memoryTypes[0].propertyFlags;
    local_5e8._22_2_ = local_280.memoryTypes[0].propertyFlags._2_2_;
    builtin_strncpy((char *)(local_5e8._0_8_ + 0xe),"atches r",8);
    builtin_strncpy((char *)(local_5e8._0_8_ + 0x16),"eference",8);
    *(undefined8 *)local_5e8._0_8_ = 0x6920746c75736552;
    *(undefined8 *)(local_5e8._0_8_ + 8) = 0x74616d206567616d;
    local_5e8._8_4_ = local_280.memoryTypeCount;
    local_5e8._12_4_ = local_280.memoryTypes[0].propertyFlags;
    *(char *)(local_5e8._0_8_ + local_280._0_8_) = '\0';
    local_648->m_code = QP_TEST_RESULT_PASS;
    (local_648->m_description)._M_dataplus._M_p = (pointer)&(local_648->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_648->m_description,local_5e8._0_8_,
               (char *)(local_280._0_8_ + local_5e8._0_8_));
  }
  else {
    local_5e8._16_4_ = 0x67616d49;
    local_5e8._20_2_ = 0x2065;
    local_5e8._22_2_ = 0x696d;
    local_5d0._0_6_ = 0x686374616d73;
    local_5e8._8_4_ = sRGB;
    local_5e8._12_4_ = SNORM_INT8;
    local_5d0[6] = 0;
    local_648->m_code = QP_TEST_RESULT_FAIL;
    (local_648->m_description)._M_dataplus._M_p = (pointer)&(local_648->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_648->m_description,pp_Var1);
  }
  if ((_func_int **)local_5e8._0_8_ != pp_Var1) {
    operator_delete((void *)local_5e8._0_8_,
                    CONCAT26(local_5e8._22_2_,CONCAT24(local_5e8._20_2_,local_5e8._16_4_)) + 1);
  }
  ReferenceRenderer::~ReferenceRenderer(&local_330);
  rr::FragmentShader::~FragmentShader(&local_378.super_FragmentShader);
  rr::VertexShader::~VertexShader(&local_3c8);
  return pTVar10;
}

Assistant:

tcu::TestStatus BlendTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return verifyImage();
}